

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsq.hpp
# Opt level: O0

Node * __thiscall
tf::BoundedTaskQueue<tf::Node_*,_8UL>::steal(BoundedTaskQueue<tf::Node_*,_8UL> *this)

{
  long lVar1;
  long lVar2;
  long *in_RDI;
  Node *item;
  int64_t b;
  int64_t t;
  memory_order __b_1;
  memory_order __b;
  undefined8 in_stack_fffffffffffffe40;
  undefined7 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4f;
  __pointer_type local_88;
  
  std::operator&(memory_order_acquire,__memory_order_mask);
  lVar2 = *in_RDI;
  std::operator&(memory_order_acquire,__memory_order_mask);
  local_88 = (__pointer_type)0x0;
  if (lVar2 < in_RDI[0x10]) {
    local_88 = std::atomic<tf::Node_*>::load
                         ((atomic<tf::Node_*> *)
                          CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),
                          (memory_order)((ulong)in_stack_fffffffffffffe40 >> 0x20));
    LOCK();
    lVar1 = *in_RDI;
    if (lVar2 == lVar1) {
      *in_RDI = lVar2 + 1;
    }
    UNLOCK();
    if (lVar2 != lVar1) {
      return (Node *)0x0;
    }
  }
  return local_88;
}

Assistant:

T BoundedTaskQueue<T, LogSize>::steal() {
  int64_t t = _top.load(std::memory_order_acquire);
  std::atomic_thread_fence(std::memory_order_seq_cst);
  int64_t b = _bottom.load(std::memory_order_acquire);
  
  T item{nullptr};

  if(t < b) {
    item = _buffer[t & BufferMask].load(std::memory_order_relaxed);
    if(!_top.compare_exchange_strong(t, t+1,
                                     std::memory_order_seq_cst,
                                     std::memory_order_relaxed)) {
      return nullptr;
    }
  }

  return item;
}